

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall
QGraphicsScenePrivate::registerScenePosItem(QGraphicsScenePrivate *this,QGraphicsItem *item)

{
  undefined1 *puVar1;
  QGraphicsItem *pQVar2;
  QGraphicsItemPrivate *pQVar3;
  long in_FS_OFFSET;
  QGraphicsItem *copy;
  QHashDummyValue local_19;
  QGraphicsItem *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = item;
  QHash<QGraphicsItem*,QHashDummyValue>::emplace<QHashDummyValue_const&>
            ((QHash<QGraphicsItem*,QHashDummyValue> *)&this->scenePosItems,&local_18,&local_19);
  pQVar3 = (item->d_ptr).d;
  while (pQVar2 = pQVar3->parent, pQVar2 != (QGraphicsItem *)0x0) {
    puVar1 = &((pQVar2->d_ptr).d)->field_0x168;
    *(uint *)puVar1 = *(uint *)puVar1 | 0x80;
    pQVar3 = (pQVar2->d_ptr).d;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::registerScenePosItem(QGraphicsItem *item)
{
    scenePosItems.insert(item);
    setScenePosItemEnabled(item, true);
}